

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDL3STARSINSOUTH_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000598;
  double *in_stack_000005a0;
  double *in_stack_000005a8;
  double *in_stack_000005b0;
  int in_stack_000005bc;
  int in_stack_000005c0;
  int *in_stack_000005d0;
  int *in_stack_000005d8;
  int *in_stack_000005e0;
  
  TVar1 = TA_CDL3STARSINSOUTH(in_stack_000005c0,in_stack_000005bc,in_stack_000005b0,
                              in_stack_000005a8,in_stack_000005a0,in_stack_00000598,
                              in_stack_000005d0,in_stack_000005d8,in_stack_000005e0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDL3STARSINSOUTH_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDL3STARSINSOUTH(
/* Generated */                          startIdx,
/* Generated */                          endIdx,
/* Generated */                          params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                          params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                          params->in[0].data.inPrice.low, /* inLow */
/* Generated */                          params->in[0].data.inPrice.close, /* inClose */
/* Generated */                          outBegIdx, 
/* Generated */                          outNBElement, 
/* Generated */                          params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }